

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O1

void __thiscall PRED<TTA>::PerformLabeling(PRED<TTA> *this)

{
  long lVar1;
  uint *puVar2;
  char *pcVar3;
  char cVar4;
  int *piVar5;
  Mat1b *pMVar6;
  Mat1i *pMVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint *puVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  char *pcVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  uint *puVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar5 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar5,piVar5[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar28 = *(int *)&pMVar6->field_0x8;
  iVar17 = *(int *)&pMVar6->field_0xc;
  TTA::Alloc(((iVar17 - (iVar17 + 1 >> 0x1f)) + 1 >> 1) * ((iVar28 - (iVar28 + 1 >> 0x1f)) + 1 >> 1)
             + 1);
  puVar2 = TTA::rtable_;
  *TTA::rtable_ = 0;
  puVar11 = TTA::tail_;
  puVar24 = TTA::next_;
  TTA::length_ = 1;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar28 = *(int *)&pMVar6->field_0xc;
  lVar29 = (long)iVar28;
  uVar13 = *(uint *)&pMVar6->field_0x8;
  if (0 < lVar29) {
    lVar31 = *(long *)&pMVar6->field_0x10;
    lVar26 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    uVar27 = 0;
    do {
      iVar17 = (int)uVar27;
      if (*(char *)(lVar31 + iVar17) != '\0') {
        puVar2[TTA::length_] = TTA::length_;
        puVar24[TTA::length_] = 0xffffffff;
        puVar11[TTA::length_] = TTA::length_;
        uVar12 = TTA::length_ + 1;
        *(uint *)(lVar26 + (long)iVar17 * 4) = TTA::length_;
        TTA::length_ = uVar12;
        if (iVar28 <= iVar17 + 1) break;
        uVar27 = (ulong)(iVar17 + 1);
        while (*(char *)(lVar31 + uVar27) != '\0') {
          *(undefined4 *)(lVar26 + uVar27 * 4) =
               *(undefined4 *)(lVar26 + (long)((int)uVar27 + -1) * 4);
          uVar27 = uVar27 + 1;
          if (iVar28 == (int)uVar27) goto LAB_0019e257;
        }
      }
      uVar12 = (int)uVar27 + 1;
      uVar27 = (ulong)uVar12;
    } while ((int)uVar12 < iVar28);
  }
LAB_0019e257:
  if (1 < (int)uVar13) {
    uVar27 = 1;
    lVar31 = 0;
    do {
      pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar16 = *(long *)&pMVar6->field_0x10;
      lVar8 = **(long **)&pMVar6->field_0x48;
      lVar30 = lVar8 * uVar27;
      lVar26 = lVar16 + lVar30;
      pcVar18 = (char *)(lVar26 - lVar8);
      lVar9 = *(long *)&pMVar7->field_0x10;
      lVar10 = **(long **)&pMVar7->field_0x48;
      lVar14 = lVar10 * uVar27;
      puVar2 = (uint *)(lVar9 + lVar14);
      puVar24 = (uint *)((long)puVar2 - lVar10);
      iVar28 = (int)(lVar29 + -1);
      if (iVar28 == 0) {
        if (*(char *)(lVar16 + lVar30) != '\0') {
          if (*pcVar18 == '\0') {
            TTA::rtable_[TTA::length_] = TTA::length_;
            TTA::next_[TTA::length_] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar12 = TTA::length_ + 1;
            *puVar2 = TTA::length_;
            TTA::length_ = uVar12;
          }
          else {
            *puVar2 = *puVar24;
          }
        }
      }
      else {
        if (*(char *)(lVar16 + lVar30) == '\0') {
          uVar21 = 0;
          goto LAB_0019e3da;
        }
        if (*pcVar18 == '\0') {
          if (pcVar18[1] == '\0') {
            TTA::rtable_[TTA::length_] = TTA::length_;
            TTA::next_[TTA::length_] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar12 = TTA::length_ + 1;
            *puVar2 = TTA::length_;
            TTA::length_ = uVar12;
            iVar17 = 0;
            goto LAB_0019e607;
          }
          *puVar2 = puVar24[1];
          iVar17 = 0;
          goto LAB_0019e759;
        }
        *puVar2 = *puVar24;
        uVar21 = 0;
LAB_0019e783:
        iVar17 = (int)uVar21;
        iVar20 = iVar17 + 1;
        if (iVar20 < iVar28) {
          lVar25 = (long)iVar17;
          lVar15 = lVar14 + lVar25 * 4;
          lVar23 = 0;
          while( true ) {
            iVar20 = (int)(lVar25 + 1);
            if (*(char *)(lVar30 + lVar25 + lVar16 + 1 + lVar23) == '\0') {
              uVar12 = iVar20 + (int)lVar23;
              goto LAB_0019e8a3;
            }
            if (*(char *)(lVar8 * lVar31 + lVar25 + lVar16 + 1 + lVar23) == '\0') break;
            *(undefined4 *)(lVar9 + 4 + lVar15 + lVar23 * 4) =
                 *(undefined4 *)(lVar10 * lVar31 + lVar25 * 4 + lVar9 + 4 + lVar23 * 4);
            lVar23 = lVar23 + 1;
            if (lVar25 + (1 - lVar29) + 1 + lVar23 == 0) {
              iVar17 = iVar17 + (int)lVar23;
              iVar20 = iVar20 + (int)lVar23;
              goto LAB_0019e850;
            }
          }
          uVar21 = lVar25 + 1 + lVar23;
          iVar17 = iVar17 + (int)lVar23;
          iVar20 = iVar17 + 2;
          if (pcVar18[iVar20] == '\0') {
            *(uint *)(lVar15 + lVar9 + 4 + lVar23 * 4) = puVar2[iVar17];
            iVar17 = (int)uVar21;
            goto LAB_0019e607;
          }
          uVar12 = TTA::Merge(puVar2[iVar17],puVar24[iVar20]);
          *(uint *)(lVar15 + lVar9 + 4 + lVar23 * 4) = uVar12;
LAB_0019e754:
          do {
            iVar17 = (int)uVar21;
LAB_0019e759:
            lVar15 = (long)iVar17;
            uVar21 = lVar15 + 1;
            cVar4 = *(char *)(lVar26 + 1 + lVar15);
            if (iVar28 <= (int)uVar21) {
              if (cVar4 != '\0') {
                puVar2[lVar15 + 1] = puVar24[lVar15 + 1];
              }
              goto LAB_0019e927;
            }
            if (cVar4 != '\0') {
              puVar2[lVar15 + 1] = puVar24[lVar15 + 1];
              goto LAB_0019e783;
            }
LAB_0019e3da:
            while( true ) {
              lVar25 = (long)(int)uVar21;
              lVar15 = lVar25 << 0x20;
              lVar23 = 0;
              do {
                lVar19 = lVar15;
                lVar22 = lVar19 >> 0x20;
                if (lVar29 + -1 <= lVar25 + lVar23 + 1) {
                  lVar16 = lVar19 + 0x100000000 >> 0x20;
                  if (*(char *)(lVar26 + lVar16) == '\0') goto LAB_0019e927;
                  if (pcVar18[lVar16] == '\0') {
                    if (pcVar18[lVar22] == '\0') {
                      TTA::rtable_[TTA::length_] = TTA::length_;
                      TTA::next_[TTA::length_] = 0xffffffff;
                      TTA::tail_[TTA::length_] = TTA::length_;
                      uVar12 = TTA::length_ + 1;
                      puVar2[lVar16] = TTA::length_;
                      TTA::length_ = uVar12;
                      goto LAB_0019e927;
                    }
                    uVar12 = puVar24[lVar22];
                  }
                  else {
                    uVar12 = puVar24[lVar16];
                  }
                  puVar2[lVar16] = uVar12;
                  goto LAB_0019e927;
                }
                lVar1 = lVar23 + 1;
                pcVar3 = (char *)(lVar25 + lVar30 + lVar16 + 1 + lVar23);
                lVar15 = lVar19 + 0x100000000;
                lVar23 = lVar1;
              } while (*pcVar3 == '\0');
              uVar21 = (uVar21 & 0xffffffff) + lVar1;
              if (*(char *)(lVar1 + lVar8 * lVar31 + lVar25 + lVar16) != '\0') {
                *(undefined4 *)(lVar14 + lVar25 * 4 + lVar9 + lVar1 * 4) =
                     *(undefined4 *)(lVar10 * lVar31 + lVar25 * 4 + lVar9 + lVar1 * 4);
                goto LAB_0019e783;
              }
              lVar15 = lVar19 + 0x200000000 >> 0x20;
              if (pcVar18[lVar15] != '\0') break;
              if (pcVar18[lVar22] == '\0') {
                TTA::rtable_[TTA::length_] = TTA::length_;
                TTA::next_[TTA::length_] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                uVar12 = TTA::length_ + 1;
                *(uint *)(lVar14 + lVar25 * 4 + lVar9 + lVar1 * 4) = TTA::length_;
                TTA::length_ = uVar12;
              }
              else {
                *(uint *)(lVar14 + lVar25 * 4 + lVar9 + lVar1 * 4) = puVar24[lVar22];
              }
              iVar17 = (int)uVar21;
LAB_0019e607:
              iVar20 = iVar17 + 1;
              if (iVar28 <= iVar20) {
LAB_0019e6c1:
                lVar16 = (long)iVar20;
                if (*(char *)(lVar26 + lVar16) != '\0') goto LAB_0019e91f;
                goto LAB_0019e927;
              }
              lVar23 = (long)iVar17;
              iVar20 = iVar17 + 1;
              lVar25 = lVar23 << 0x20;
              lVar15 = lVar14 + lVar23 * 4;
              lVar19 = lVar9 + lVar15;
              lVar22 = 0;
              while (*(char *)(lVar30 + lVar23 + lVar16 + 1 + lVar22) != '\0') {
                if (*(char *)(lVar8 * lVar31 + lVar23 + lVar16 + 2 + lVar22) != '\0') {
                  uVar21 = (ulong)(uint)(iVar20 + (int)lVar22);
                  uVar12 = TTA::Merge(*(uint *)((long)puVar2 + (lVar25 >> 0x1e)),
                                      *(uint *)(lVar10 * lVar31 + lVar23 * 4 + lVar9 + 8 +
                                               lVar22 * 4));
                  *(uint *)(lVar15 + lVar9 + 4 + lVar22 * 4) = uVar12;
                  goto LAB_0019e754;
                }
                *(undefined4 *)(lVar19 + 4 + lVar22 * 4) = *(undefined4 *)(lVar19 + lVar22 * 4);
                lVar25 = lVar25 + 0x100000000;
                lVar22 = lVar22 + 1;
                if ((1 - lVar29) + lVar23 + 1 + lVar22 == 0) {
                  iVar17 = iVar17 + (int)lVar22;
                  iVar20 = iVar20 + (int)lVar22;
                  goto LAB_0019e6c1;
                }
              }
              uVar12 = iVar20 + (int)lVar22;
LAB_0019e8a3:
              uVar21 = (ulong)uVar12;
            }
            if (pcVar18[lVar22] == '\0') {
              uVar12 = puVar24[lVar15];
            }
            else {
              uVar12 = TTA::Merge(puVar24[lVar22],puVar24[lVar15]);
            }
            *(uint *)(lVar14 + lVar25 * 4 + lVar9 + lVar1 * 4) = uVar12;
          } while( true );
        }
LAB_0019e850:
        lVar16 = (long)iVar20;
        if (*(char *)(lVar26 + lVar16) != '\0') {
          if (pcVar18[lVar16] == '\0') {
LAB_0019e91f:
            uVar12 = puVar2[iVar17];
          }
          else {
            uVar12 = puVar24[lVar16];
          }
          puVar2[lVar16] = uVar12;
        }
      }
LAB_0019e927:
      uVar27 = uVar27 + 1;
      lVar31 = lVar31 + 1;
    } while (uVar27 != uVar13);
  }
  puVar2 = TTA::rtable_;
  uVar13 = 1;
  if (1 < TTA::length_) {
    uVar13 = 1;
    uVar27 = 1;
    do {
      if (uVar27 == puVar2[uVar27]) {
        uVar13 = uVar13 + 1;
        uVar12 = uVar13;
      }
      else {
        uVar12 = puVar2[puVar2[uVar27]];
      }
      puVar2[uVar27] = uVar12;
      uVar27 = uVar27 + 1;
    } while (uVar27 < TTA::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar13;
  puVar2 = TTA::rtable_;
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  if (0 < *(int *)&pMVar7->field_0x8) {
    lVar29 = *(long *)&pMVar7->field_0x10;
    lVar31 = **(long **)&pMVar7->field_0x48;
    lVar26 = 0;
    do {
      iVar28 = *(int *)&pMVar7->field_0xc;
      if ((long)iVar28 != 0) {
        lVar16 = 0;
        do {
          *(uint *)(lVar29 + lVar16) = puVar2[*(uint *)(lVar29 + lVar16)];
          lVar16 = lVar16 + 4;
        } while ((long)iVar28 * 4 != lVar16);
      }
      lVar26 = lVar26 + 1;
      lVar29 = lVar29 + lVar31;
    } while (lVar26 < *(int *)&pMVar7->field_0x8);
  }
  TTA::Dealloc();
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img_row[c]>0
#define CONDITION_P img_row_prev[c-1]>0
#define CONDITION_Q img_row_prev[c]>0
#define CONDITION_R img_row_prev[c+1]>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#define COLS w

        {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(0);

#include "labeling_grana_2016_forest_0.inc.h"

        }

        for (int r = 1; r < h; ++r) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);

#include "labeling_grana_2016_forest.inc.h"  

        }//End rows's for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R

    // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *b = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *e = b + img_labels_.cols;
            for (; b != e; ++b) {
                *b = LabelsSolver::GetLabel(*b);
            }
        }

        LabelsSolver::Dealloc();
    }